

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpapi_curl.c
# Opt level: O0

void HTTPAPI_CloseConnection(HTTP_HANDLE handle)

{
  HTTP_HANDLE_DATA *httpHandleData;
  HTTP_HANDLE handle_local;
  
  if (handle != (HTTP_HANDLE)0x0) {
    free(handle->hostURL);
    handle->hostURL = (char *)0x0;
    curl_easy_cleanup(handle->curl);
    if (handle->engine != (ENGINE *)0x0) {
      ENGINE_free((ENGINE *)handle->engine);
      handle->engine = (ENGINE *)0x0;
    }
    if (handle->engineId != (char *)0x0) {
      free(handle->engineId);
      handle->engineId = (char *)0x0;
    }
    free(handle);
  }
  return;
}

Assistant:

void HTTPAPI_CloseConnection(HTTP_HANDLE handle)
{
    HTTP_HANDLE_DATA* httpHandleData = (HTTP_HANDLE_DATA*)handle;
    if (httpHandleData != NULL)
    {
        free(httpHandleData->hostURL);
        httpHandleData->hostURL = NULL;
        curl_easy_cleanup(httpHandleData->curl);
#ifdef USE_OPENSSL
#ifndef OPENSSL_NO_ENGINE
        if (httpHandleData->engine != NULL)
        {
            ENGINE_free(httpHandleData->engine);
            httpHandleData->engine = NULL;
        }

        if (httpHandleData->engineId != NULL)
        {
            free(httpHandleData->engineId);
            httpHandleData->engineId = NULL;
        }
#endif // OPENSSL_NO_ENGINE
#elif USE_MBEDTLS
        mbedtls_x509_crt_free(&httpHandleData->cert);
        mbedtls_pk_free(&httpHandleData->key);
        mbedtls_x509_crt_free(&httpHandleData->trusted_certificates);
#endif
        free(httpHandleData);
    }
}